

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::Handler(Handler *this)

{
  this->purchaseCpuCoreParameter = 0x4b;
  this->purchaseMemorySizeParameter = 0x19;
  this->purchaseEnergyCostParameter = 0;
  this->migrateCpuCoreParameter = 0x4b;
  this->migrateMemorySizeParameter = 0x19;
  this->migrateEnergyCostParameter = 0;
  this->deployCpuCoreParameter = 0x4b;
  this->deployMemorySizeParameter = 0x19;
  this->deployEnergyCostParameter = 0;
  this->N = '\0';
  this->M = 0;
  this->T = 0;
  this->K = 0;
  (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->virtualMachines).super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->virtualMachines).super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->virtualMachines).super__Vector_base<VirtualMachine,_std::allocator<VirtualMachine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->requests).
  super__Vector_base<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->requests).
  super__Vector_base<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->requests).
  super__Vector_base<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addRequestCounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addRequestCounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addRequestCounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->virtualMachineMap)._M_h._M_buckets = &(this->virtualMachineMap)._M_h._M_single_bucket;
  (this->virtualMachineMap)._M_h._M_bucket_count = 1;
  (this->virtualMachineMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->virtualMachineMap)._M_h._M_element_count = 0;
  (this->virtualMachineMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->virtualMachineMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->virtualMachineMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->idDeployedVMMap)._M_h._M_buckets = &(this->idDeployedVMMap)._M_h._M_single_bucket;
  (this->idDeployedVMMap)._M_h._M_bucket_count = 1;
  (this->idDeployedVMMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idDeployedVMMap)._M_h._M_element_count = 0;
  (this->idDeployedVMMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idDeployedVMMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idDeployedVMMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->idVirtualMachineMap)._M_h._M_buckets = &(this->idVirtualMachineMap)._M_h._M_single_bucket;
  (this->idVirtualMachineMap)._M_h._M_bucket_count = 1;
  (this->idVirtualMachineMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idVirtualMachineMap)._M_h._M_element_count = 0;
  (this->idVirtualMachineMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idVirtualMachineMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idVirtualMachineMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->deployedVMNum = 0;
  this->totalPurchasedServerNum = 0;
  (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->deployedVMs).
  super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deployedVMs).
  super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->purchasedServers).super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deployedVMs).
  super__Vector_base<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->purchasedServers).super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->purchasedServers).super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->today = 0;
  std::ofstream::ofstream(&this->LOG);
  (this->start).__d.__r = 0;
  this->totalMigrationNum = 0;
  this->totalHardwareCost = 0;
  this->totalEnergyCost = 0;
  return;
}

Assistant:

Handler::Handler() {
}